

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smd.c
# Opt level: O0

int lws_smd_msg_distribute(lws_context *ctx)

{
  lws_dll2 *plVar1;
  bool bVar2;
  int iVar3;
  lws_smd_peer_t *pr;
  lws_dll2 *p1;
  lws_dll2 *p;
  char more;
  lws_context *ctx_local;
  
  if ((ctx->smd).owner_messages.count != 0) {
    (ctx->smd).delivering = '\x01';
    do {
      bVar2 = false;
      pthread_mutex_lock((pthread_mutex_t *)&(ctx->smd).lock_peers);
      p1 = (ctx->smd).owner_peers.head;
      while (p1 != (lws_dll2 *)0x0) {
        plVar1 = p1->next;
        iVar3 = _lws_smd_msg_deliver_peer(ctx,(lws_smd_peer_t *)p1);
        bVar2 = (bool)(bVar2 | iVar3 != 0);
        p1 = plVar1;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&(ctx->smd).lock_peers);
    } while (bVar2);
    (ctx->smd).delivering = '\0';
  }
  return 0;
}

Assistant:

int
lws_smd_msg_distribute(struct lws_context *ctx)
{
	char more;

	/* commonly, no messages and nothing to do... */

	if (!ctx->smd.owner_messages.count)
		return 0;

	ctx->smd.delivering = 1;

	do {
		more = 0;
		lws_mutex_lock(ctx->smd.lock_peers); /* +++++++++++++++ peers */

		lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
					   ctx->smd.owner_peers.head) {
			lws_smd_peer_t *pr = lws_container_of(p, lws_smd_peer_t, list);

			more = (char)(more | !!_lws_smd_msg_deliver_peer(ctx, pr));

		} lws_end_foreach_dll_safe(p, p1);

		lws_mutex_unlock(ctx->smd.lock_peers); /* ------------- peers */
	} while (more);

	ctx->smd.delivering = 0;

	return 0;
}